

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_pairing.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                *pairing1,
               Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
               *pairing2)

{
  Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *pairing2_local;
  Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *pairing1_local;
  
  std::__cxx11::
  list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ::swap(&pairing1->barcode_,&pairing2->barcode_);
  std::
  unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
  ::swap(&pairing1->indexToBar_,&pairing2->indexToBar_);
  std::swap<unsigned_int>(&pairing1->nextPosition_,&pairing2->nextPosition_);
  return;
}

Assistant:

void swap(Chain_pairing& pairing1, Chain_pairing& pairing2) {
    pairing1.barcode_.swap(pairing2.barcode_);
    pairing1.indexToBar_.swap(pairing2.indexToBar_);
    std::swap(pairing1.nextPosition_, pairing2.nextPosition_);
  }